

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O0

void xm_generate_samples(xm_context_t *ctx,float *output,size_t numsamples)

{
  ulong in_RDX;
  float *in_RSI;
  float *in_RDI;
  xm_context_t *unaff_retaddr;
  size_t i;
  ulong local_20;
  
  *(ulong *)(in_RDI + 0x52) = in_RDX + *(long *)(in_RDI + 0x52);
  for (local_20 = 0; local_20 < in_RDX; local_20 = local_20 + 1) {
    xm_sample(unaff_retaddr,in_RDI,in_RSI);
  }
  return;
}

Assistant:

void xm_generate_samples(xm_context_t* ctx, float* output, size_t numsamples) {
	ctx->generated_samples += numsamples;

	for(size_t i = 0; i < numsamples; i++) {
		xm_sample(ctx, output + (2 * i), output + (2 * i + 1));
	}
}